

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[28],int>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [28],int *params_2)

{
  ArrayPtr<const_char> local_60;
  undefined8 local_50;
  undefined8 uStack_48;
  CappedArray<char,_14UL> local_40;
  
  local_50 = *(undefined8 *)this;
  uStack_48 = *(undefined8 *)(this + 8);
  local_60 = toCharSequence<char_const(&)[28]>((char (*) [28])params);
  toCharSequence<int>(&local_40,(int *)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,(ArrayPtr<const_char> *)&local_40,
             (CappedArray<char,_14UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}